

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O0

bool runArmips(ArmipsArguments *settings)

{
  pointer *this;
  int64_t memoryAddress;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ExpressionFunctionHandler *pEVar4;
  vector<LabelDefinition,_std::allocator<LabelDefinition>_> *pvVar5;
  reference name;
  reference pvVar6;
  reference this_01;
  string *name_00;
  size_type sVar7;
  reference __x;
  AllocationStats local_810;
  ulong local_790;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  bool local_761;
  undefined1 local_760 [7];
  bool result;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> content;
  TextFile input;
  LabelDefinition *label;
  iterator __end1;
  iterator __begin1;
  vector<LabelDefinition,_std::allocator<LabelDefinition>_> *__range1;
  size_t i;
  Token token;
  TempData tempData;
  undefined1 local_128 [8];
  SymbolData symData;
  Parser parser;
  ArmipsArguments *settings_local;
  
  Global.Section = 0;
  Global.nocash = false;
  Global.FileInfo.TotalLineCount = 0;
  Global.relativeInclude = false;
  Global.multiThreading = true;
  Architecture::setCurrent(&InvalidArchitecture.super_Architecture);
  Tokenizer::clearEquValues();
  Logger::clear();
  Allocations::clear();
  EncodingTable::clear(&Global.Table);
  SymbolTable::clear(&Global.symbolTable);
  FileList::clear(&Global.fileList);
  Global.FileInfo.TotalLineCount = 0;
  Global.FileInfo.LineNumber = 0;
  Global.FileInfo.FileNum = 0;
  CArmArchitecture::clear(&Arm);
  pEVar4 = ExpressionFunctionHandler::instance();
  ExpressionFunctionHandler::reset(pEVar4);
  pEVar4 = ExpressionFunctionHandler::instance();
  registerExpressionFunctions(pEVar4);
  Parser::Parser((Parser *)&symData.currentModule);
  SymbolData::SymbolData((SymbolData *)local_128);
  TempData::TempData((TempData *)((long)&token.originalText.field_2 + 8));
  Logger::setSilent((bool)(settings->silent & 1));
  Logger::setErrorOnWarning((bool)(settings->errorOnWarning & 1));
  bVar2 = ghc::filesystem::path::empty(&settings->symFileName);
  if (!bVar2) {
    SymbolData::setNocashSymFileName
              ((SymbolData *)local_128,&settings->symFileName,settings->symFileVersion);
  }
  bVar2 = ghc::filesystem::path::empty(&settings->tempFileName);
  if (!bVar2) {
    TempData::setFileName
              ((TempData *)((long)&token.originalText.field_2 + 8),&settings->tempFileName);
  }
  Token::Token((Token *)&i);
  for (__range1 = (vector<LabelDefinition,_std::allocator<LabelDefinition>_> *)0x0;
      pvVar5 = (vector<LabelDefinition,_std::allocator<LabelDefinition>_> *)
               std::vector<EquationDefinition,_std::allocator<EquationDefinition>_>::size
                         (&settings->equList), __range1 < pvVar5;
      __range1 = (vector<LabelDefinition,_std::allocator<LabelDefinition>_> *)
                 ((long)&(__range1->
                         super__Vector_base<LabelDefinition,_std::allocator<LabelDefinition>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    name = std::vector<EquationDefinition,_std::allocator<EquationDefinition>_>::operator[]
                     (&settings->equList,(size_type)__range1);
    pvVar6 = std::vector<EquationDefinition,_std::allocator<EquationDefinition>_>::operator[]
                       (&settings->equList,(size_type)__range1);
    Parser::addEquation((Parser *)&symData.currentModule,(Token *)&i,&name->name,&pvVar6->value);
  }
  SymbolTable::addLabels(&Global.symbolTable,&settings->labels);
  __end1 = std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>::begin(&settings->labels);
  label = (LabelDefinition *)
          std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>::end(&settings->labels);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<LabelDefinition_*,_std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>_>
                                     *)&label), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<LabelDefinition_*,_std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>_>
              ::operator*(&__end1);
    memoryAddress = this_01->value;
    name_00 = Identifier::string_abi_cxx11_(&this_01->name);
    SymbolData::addLabel((SymbolData *)local_128,memoryAddress,name_00);
    __gnu_cxx::
    __normal_iterator<LabelDefinition_*,_std::vector<LabelDefinition,_std::allocator<LabelDefinition>_>_>
    ::operator++(&__end1);
  }
  bVar2 = Logger::hasError();
  if (bVar2) {
    settings_local._7_1_ = false;
    goto LAB_00131af1;
  }
  TextFile::TextFile((TextFile *)&content);
  if (settings->mode == FILE) {
    Global.memoryMode = false;
    uVar3 = TextFile::open((TextFile *)&content,(char *)&settings->inputFileName,0,5);
    if ((uVar3 & 1) != 0) goto LAB_00131838;
    Logger::printError<>(Error,"Could not open file");
    settings_local._7_1_ = false;
  }
  else {
    if (settings->mode == MEMORY) {
      Global.memoryMode = true;
      std::shared_ptr<AssemblerFile>::operator=(&Global.memoryFile,&settings->memoryFile);
      TextFile::openMemory((TextFile *)&content,&settings->content);
    }
LAB_00131838:
    Parser::parseFile((Parser *)local_760,(TextFile *)&symData.currentModule,SUB81(&content,0));
    Logger::printQueue();
    bVar2 = Logger::hasError();
    local_761 = (bool)((bVar2 ^ 0xffU) & 1);
    if ((local_761 != false) &&
       (bVar2 = std::operator!=((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                 *)local_760,(nullptr_t)0x0), bVar2)) {
      this = &errors.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::unique_ptr
                ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)this,
                 (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_760
                );
      local_761 = encodeAssembly((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                  *)this,(SymbolData *)local_128,
                                 (TempData *)((long)&token.originalText.field_2 + 8));
      std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
                 &errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    bVar2 = FileManager::hasOpenFile(g_fileManager);
    if (bVar2) {
      if ((Global.memoryMode & 1U) == 0) {
        Logger::printError<>(Warning,"File not closed");
      }
      FileManager::closeFile(g_fileManager);
    }
    if (settings->errorsResult !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      Logger::getErrors_abi_cxx11_();
      for (local_790 = 0; uVar1 = local_790,
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i_1), uVar1 < sVar7; local_790 = local_790 + 1) {
        this_00 = settings->errorsResult;
        __x = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i_1,local_790);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,__x);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i_1);
    }
    if ((settings->showStats & 1U) != 0) {
      Allocations::collectStats();
      printStats(&local_810);
    }
    bVar2 = Logger::hasError();
    if (bVar2) {
      settings_local._7_1_ = false;
    }
    else {
      settings_local._7_1_ = local_761;
    }
    std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
              ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_760);
  }
  TextFile::~TextFile((TextFile *)&content);
LAB_00131af1:
  Token::~Token((Token *)&i);
  TempData::~TempData((TempData *)((long)&token.originalText.field_2 + 8));
  SymbolData::~SymbolData((SymbolData *)local_128);
  Parser::~Parser((Parser *)&symData.currentModule);
  return settings_local._7_1_;
}

Assistant:

bool runArmips(ArmipsArguments& settings)
{
	// initialize and reset global data
	Global.Section = 0;
	Global.nocash = false;
	Global.FileInfo.TotalLineCount = 0;
	Global.relativeInclude = false;
	Global.multiThreading = true;
	Architecture::setCurrent(InvalidArchitecture);

	Tokenizer::clearEquValues();
	Logger::clear();
	Allocations::clear();
	Global.Table.clear();
	Global.symbolTable.clear();

	Global.fileList.clear();
	Global.FileInfo.TotalLineCount = 0;
	Global.FileInfo.LineNumber = 0;
	Global.FileInfo.FileNum = 0;

	Arm.clear();

	ExpressionFunctionHandler::instance().reset();
	registerExpressionFunctions(ExpressionFunctionHandler::instance());

	// process settings
	Parser parser;
	SymbolData symData;
	TempData tempData;
	
	Logger::setSilent(settings.silent);
	Logger::setErrorOnWarning(settings.errorOnWarning);

	if (!settings.symFileName.empty())
		symData.setNocashSymFileName(settings.symFileName, settings.symFileVersion);

	if (!settings.tempFileName.empty())
		tempData.setFileName(settings.tempFileName);

	Token token;
	for (size_t i = 0; i < settings.equList.size(); i++)
	{
		parser.addEquation(token, settings.equList[i].name, settings.equList[i].value);
	}

	Global.symbolTable.addLabels(settings.labels);
	for (const LabelDefinition& label : settings.labels)
	{
		symData.addLabel(label.value, label.name.string());
	}

	if (Logger::hasError())
		return false;

	// run assembler
	TextFile input;
	switch (settings.mode)
	{
	case ArmipsMode::FILE:
		Global.memoryMode = false;		
		if (!input.open(settings.inputFileName,TextFile::Read))
		{
			Logger::printError(Logger::Error, "Could not open file");
			return false;
		}
		break;
	case ArmipsMode::MEMORY:
		Global.memoryMode = true;
		Global.memoryFile = settings.memoryFile;
		input.openMemory(settings.content);
		break;
	}

	std::unique_ptr<CAssemblerCommand> content = parser.parseFile(input);
	Logger::printQueue();

	bool result = !Logger::hasError();
	if (result && content != nullptr)
		result = encodeAssembly(std::move(content), symData, tempData);
	
	if (g_fileManager->hasOpenFile())
	{
		if (!Global.memoryMode)
			Logger::printError(Logger::Warning, "File not closed");
		g_fileManager->closeFile();
	}

	// return errors
	if (settings.errorsResult != nullptr)
	{
		std::vector<std::string> errors = Logger::getErrors();
		for (size_t i = 0; i < errors.size(); i++)
			settings.errorsResult->push_back(errors[i]);
	}

	if (settings.showStats)
		printStats(Allocations::collectStats());

	if (Logger::hasError())
	{
		return false;
	}

	return result;
}